

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

void elf_initsymlist(SymTabList *sl,StrTabList *strl,size_t tabsize,size_t symsize,
                    _func_void_void_ptr_uint32_t_uint64_t_uint64_t_uint8_t_uint8_t_uint16_t_bool
                    *init)

{
  node *pnVar1;
  node *in_RCX;
  node *in_RDX;
  node *in_RSI;
  list *in_RDI;
  node *in_R8;
  uint64_t in_stack_00000038;
  char *in_stack_00000040;
  SymTabList *in_stack_00000048;
  uint16_t in_stack_00000060;
  size_t in_stack_ffffffffffffffd0;
  
  initlist(in_RDI);
  in_RDI[1].last = in_RDX;
  pnVar1 = (node *)alloczero(in_stack_ffffffffffffffd0);
  in_RDI[1].dummy = pnVar1;
  in_RDI[1].first = in_RSI;
  in_RDI[2].first = in_RCX;
  in_RDI[2].last = in_R8;
  *(undefined4 *)((long)&in_RDI[2].dummy + 4) = 0;
  *(undefined4 *)&in_RDI[2].dummy = 0;
  elf_addsym(in_stack_00000048,in_stack_00000040,in_stack_00000038,(uint64_t)sl,strl._7_1_,
             strl._6_1_,in_stack_00000060);
  return;
}

Assistant:

void elf_initsymlist(struct SymTabList *sl,struct StrTabList *strl,
                     size_t tabsize,size_t symsize,
                     void (*init)(void *,uint32_t,uint64_t,uint64_t,
                                  uint8_t,uint8_t,uint16_t,bool))
{
  initlist(&sl->l);
  sl->htabsize = tabsize;
  sl->hashtab = alloczero(tabsize * sizeof(struct SymbolNode *));
  sl->strlist = strl;
  sl->elfsymsize = symsize;
  sl->initsym = init;
  sl->nextindex = sl->globalindex = 0;
  elf_addsym(sl,noname,0,0,0,0,SHN_UNDEF);
}